

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O2

RowVersionManager * __thiscall duckdb::RowGroup::GetOrCreateVersionInfo(RowGroup *this)

{
  RowVersionManager *pRVar1;
  optional_ptr<duckdb::RowVersionManager,_true> vinfo;
  optional_ptr<duckdb::RowVersionManager,_true> local_28;
  
  local_28 = GetVersionInfo(this);
  if (local_28.ptr == (RowVersionManager *)0x0) {
    GetOrCreateVersionInfoInternal((RowGroup *)&stack0xffffffffffffffe0);
    pRVar1 = shared_ptr<duckdb::RowVersionManager,_true>::operator*
                       ((shared_ptr<duckdb::RowVersionManager,_true> *)&stack0xffffffffffffffe0);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe8);
  }
  else {
    pRVar1 = optional_ptr<duckdb::RowVersionManager,_true>::operator*(&local_28);
  }
  return pRVar1;
}

Assistant:

RowVersionManager &RowGroup::GetOrCreateVersionInfo() {
	auto vinfo = GetVersionInfo();
	if (vinfo) {
		// version info exists - return it directly
		return *vinfo;
	}
	return *GetOrCreateVersionInfoInternal();
}